

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O2

int Ver_ParseSignal(Ver_Man_t *pMan,Abc_Ntk_t *pNtk,Ver_SignalType_t SigType)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  Ver_SignalType_t VVar4;
  int iVar5;
  uint uVar6;
  Ver_Stream_t *pVVar7;
  bool bVar8;
  int local_440;
  int local_43c;
  int nLsb;
  int nMsb;
  char *local_428;
  Ver_Stream_t *local_420;
  char Buffer [1000];
  
  pVVar7 = pMan->pReader;
  nLsb = -1;
  nMsb = -1;
  VVar4 = SigType & ~VER_SIG_INPUT;
  local_440 = -1;
  local_43c = local_440;
  do {
    do {
      pcVar3 = Ver_ParseGetName(pMan);
      if (pcVar3 == (char *)0x0) goto LAB_002f8c5b;
      iVar2 = strcmp(pcVar3,"wire");
    } while (iVar2 == 0);
    local_428 = pcVar3;
    if ((*pcVar3 == '[') && (pMan->fNameLast == 0)) {
      if ((local_43c != -1) || (local_440 != -1)) {
        __assert_fail("nMsb == -1 && nLsb == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                      ,0x338,"int Ver_ParseSignal(Ver_Man_t *, Abc_Ntk_t *, Ver_SignalType_t)");
      }
      Ver_ParseSignalPrefix(pMan,&local_428,&nMsb,&nLsb);
      if ((*local_428 == '\0') && (local_428 = Ver_ParseGetName(pMan), local_428 == (char *)0x0))
      goto LAB_002f8c5b;
    }
    pcVar3 = local_428;
    uVar6 = nLsb;
    local_440 = nLsb;
    local_43c = nMsb;
    local_420 = pVVar7;
    if ((nMsb & nLsb) == 0xffffffff) {
      if ((SigType & ~VER_SIG_OUTPUT) == VER_SIG_INPUT) {
        Ver_ParseCreatePi(pNtk,local_428);
      }
      if (VVar4 == VER_SIG_REG) {
        Abc_NtkFindOrCreateNet(pNtk,pcVar3);
      }
      else if (VVar4 == VER_SIG_OUTPUT) {
        Ver_ParseCreatePo(pNtk,pcVar3);
      }
    }
    else {
      if ((nMsb < 0) || (nLsb < 0)) {
        __assert_fail("nMsb >= 0 && nLsb >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                      ,0x350,"int Ver_ParseSignal(Ver_Man_t *, Abc_Ntk_t *, Ver_SignalType_t)");
      }
      iVar5 = 0;
      bVar8 = (uint)nLsb < (uint)nMsb;
      iVar2 = nLsb - nMsb;
      if ((uint)nLsb < (uint)nMsb) {
        iVar2 = -(nLsb - nMsb);
      }
      Ver_ParseInsertsSuffix(pMan,local_428,nMsb,nLsb);
      for (; iVar5 <= iVar2; iVar5 = iVar5 + 1) {
        if (iVar2 < 1) {
          strcpy(Buffer,pcVar3);
        }
        else {
          sprintf(Buffer,"%s[%d]",pcVar3,(ulong)uVar6);
        }
        if ((SigType & ~VER_SIG_OUTPUT) == VER_SIG_INPUT) {
          Ver_ParseCreatePi(pNtk,Buffer);
        }
        if (VVar4 == VER_SIG_REG) {
          Abc_NtkFindOrCreateNet(pNtk,Buffer);
        }
        else if (VVar4 == VER_SIG_OUTPUT) {
          Ver_ParseCreatePo(pNtk,Buffer);
        }
        uVar6 = uVar6 + (bVar8 - 1 | 1);
      }
    }
    pVVar7 = local_420;
    cVar1 = Ver_StreamPopChar(local_420);
  } while (cVar1 == ',');
  iVar2 = 1;
  if (cVar1 != ';') {
    builtin_strncpy(pMan->sError,"Cannot parse signal line (expected , or ;).",0x2c);
    Ver_ParsePrintErrorMessage(pMan);
LAB_002f8c5b:
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int Ver_ParseSignal( Ver_Man_t * pMan, Abc_Ntk_t * pNtk, Ver_SignalType_t SigType )
{
    Ver_Stream_t * p = pMan->pReader;
    char Buffer[1000], Symbol, * pWord;
    int nMsb, nLsb, Bit, Limit, i;
    nMsb = nLsb = -1;
    while ( 1 )
    {
        // get the next word
        pWord = Ver_ParseGetName( pMan );
        if ( pWord == NULL )
            return 0;

        if ( !strcmp(pWord, "wire") )
            continue;

        // check if the range is specified
        if ( pWord[0] == '[' && !pMan->fNameLast )
        {
            assert( nMsb == -1 && nLsb == -1 );
            Ver_ParseSignalPrefix( pMan, &pWord, &nMsb, &nLsb );
            // check the case when there is space between bracket and the next word
            if ( *pWord == 0 )
            {
                // get the signal name
                pWord = Ver_ParseGetName( pMan );
                if ( pWord == NULL )
                    return 0;
            }
        }

        // create signals
        if ( nMsb == -1 && nLsb == -1 )
        {
            if ( SigType == VER_SIG_INPUT || SigType == VER_SIG_INOUT )
                Ver_ParseCreatePi( pNtk, pWord );
            if ( SigType == VER_SIG_OUTPUT || SigType == VER_SIG_INOUT )
                Ver_ParseCreatePo( pNtk, pWord );
            if ( SigType == VER_SIG_WIRE || SigType == VER_SIG_REG )
                Abc_NtkFindOrCreateNet( pNtk, pWord );
        }
        else
        {
            assert( nMsb >= 0 && nLsb >= 0 );
            // add to the hash table
            Ver_ParseInsertsSuffix( pMan, pWord, nMsb, nLsb );
            // add signals from Lsb to Msb
            Limit = nMsb > nLsb? nMsb - nLsb + 1: nLsb - nMsb + 1;
            for ( i = 0, Bit = nLsb; i < Limit; i++, Bit = nMsb > nLsb ? Bit + 1: Bit - 1  )
            {
//                sprintf( Buffer, "%s[%d]", pWord, Bit );
                if ( Limit > 1 )
                    sprintf( Buffer, "%s[%d]", pWord, Bit );
                else
                    sprintf( Buffer, "%s", pWord );
                if ( SigType == VER_SIG_INPUT || SigType == VER_SIG_INOUT )
                    Ver_ParseCreatePi( pNtk, Buffer );
                if ( SigType == VER_SIG_OUTPUT || SigType == VER_SIG_INOUT )
                    Ver_ParseCreatePo( pNtk, Buffer );
                if ( SigType == VER_SIG_WIRE || SigType == VER_SIG_REG )
                    Abc_NtkFindOrCreateNet( pNtk, Buffer );
            }
        }

        Symbol = Ver_StreamPopChar(p);
        if ( Symbol == ',' )
            continue;
        if ( Symbol == ';' )
            return 1;
        break;
    }
    sprintf( pMan->sError, "Cannot parse signal line (expected , or ;)." );
    Ver_ParsePrintErrorMessage( pMan );
    return 0;
}